

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  uint32_t uVar1;
  int iVar2;
  ZoneHashNode *__s1;
  ZoneHashNode *pZVar3;
  ulong __n;
  uint uVar4;
  bool bVar5;
  ulong local_38;
  
  local_38 = nameLength;
  uVar1 = anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_38);
  if (local_38 != 0) {
    pZVar3 = (this->_namedLabels).super_ZoneHashBase._data
             [(ulong)uVar1 % (ulong)(this->_namedLabels).super_ZoneHashBase._bucketsCount];
    bVar5 = pZVar3 == (ZoneHashNode *)0x0;
    if (!bVar5) {
      uVar4 = (uint)local_38;
      __n = local_38 & 0xffffffff;
      do {
        if (*(uint *)(pZVar3 + 0x30) == uVar4) {
          if (*(uint *)(pZVar3 + 0x30) < 0xc) {
            __s1 = pZVar3 + 0x34;
          }
          else {
            __s1 = *(ZoneHashNode **)(pZVar3 + 0x38);
          }
          iVar2 = bcmp(__s1,name,__n);
          if (iVar2 == 0) {
            if (!bVar5) {
              return *(uint32_t *)(pZVar3 + 0xc);
            }
            return 0;
          }
        }
        pZVar3 = *(ZoneHashNode **)pZVar3;
        bVar5 = pZVar3 == (ZoneHashNode *)0x0;
      } while (!bVar5);
    }
  }
  return 0;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}